

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

void helper_lswx_ppc64(CPUPPCState_conflict2 *env,target_ulong addr,uint32_t reg,uint32_t ra,
                      uint32_t rb)

{
  ulong uVar1;
  _Bool _Var2;
  uint nregs;
  ulong uVar3;
  uintptr_t unaff_retaddr;
  
  uVar1 = env->xer;
  uVar3 = uVar1 & 0x7f;
  if (uVar3 == 0) {
    return;
  }
  nregs = (int)uVar3 + 3U >> 2;
  if (ra != 0) {
    _Var2 = lsw_reg_in_range(reg,nregs,ra);
    if (_Var2) goto LAB_009df8df;
  }
  _Var2 = lsw_reg_in_range(reg,nregs,rb);
  if (!_Var2) {
    do_lsw(env,addr,(uint)uVar1 & 0x7f,reg,unaff_retaddr);
    return;
  }
LAB_009df8df:
  raise_exception_err_ra_ppc64(env,6,0x22,unaff_retaddr);
}

Assistant:

void helper_lswx(CPUPPCState *env, target_ulong addr, uint32_t reg,
                 uint32_t ra, uint32_t rb)
{
    if (likely(xer_bc != 0)) {
        int num_used_regs = DIV_ROUND_UP(xer_bc, 4);
        if (unlikely((ra != 0 && lsw_reg_in_range(reg, num_used_regs, ra)) ||
                     lsw_reg_in_range(reg, num_used_regs, rb))) {
            raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                                   POWERPC_EXCP_INVAL |
                                   POWERPC_EXCP_INVAL_LSWX, GETPC());
        } else {
            do_lsw(env, addr, xer_bc, reg, GETPC());
        }
    }
}